

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>::
load(list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char> *this,
    handle src,bool convert)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  handle src_00;
  value_conv conv;
  sequence s;
  iterator __end3;
  iterator __begin3;
  type_caster<signed_char,_void> local_79;
  handle local_78;
  handle local_70;
  iterator local_68;
  iterator local_48;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    pcVar1 = (this->value).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->value).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar1) {
      (this->value).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar1;
    }
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    local_78.m_ptr = src.m_ptr;
    local_70.m_ptr = src.m_ptr;
    reserve_maybe<std::vector<signed_char,_std::allocator<signed_char>_>,_0>
              (this,(sequence *)&local_78,&this->value);
    object::~object((object *)&local_78);
    local_48.super_object.super_handle.m_ptr = (handle)PyObject_GetIter(local_70.m_ptr);
    local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_48.ready = false;
    local_68.ready = false;
    local_68.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_68.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while( true ) {
      bVar2 = iterator::operator!=(&local_48,&local_68);
      if (!bVar2) break;
      src_00 = iterator::operator*(&local_48);
      bVar3 = type_caster<signed_char,_void>::load(&local_79,src_00,convert);
      if (!bVar3) break;
      std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                (&this->value,&local_79.value);
      iterator::operator++(&local_48);
    }
    iterator::~iterator(&local_68);
    iterator::~iterator(&local_48);
    bVar2 = !bVar2;
    object::~object((object *)&local_70);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value_conv conv;
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value>(conv));
        }
        return true;
    }